

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O0

uint processorstop(logdir *ld)

{
  int iVar1;
  char local_38 [8];
  char f [28];
  logdir *ld_local;
  
  unique0x1000039c = ld;
  if (ld->ppid != 0) {
    sig_unblock(sig_hangup);
    while (iVar1 = wait_pid(&wstat,stack0xffffffffffffffe8->ppid), iVar1 == -1) {
      pause2("error waiting for processor",stack0xffffffffffffffe8->name);
    }
    sig_block(sig_hangup);
    stack0xffffffffffffffe8->ppid = 0;
  }
  if (stack0xffffffffffffffe8->fddir == -1) {
    ld_local._4_4_ = 1;
  }
  else {
    while (iVar1 = fchdir(stack0xffffffffffffffe8->fddir), iVar1 == -1) {
      pause2("unable to change directory, want processor",stack0xffffffffffffffe8->name);
    }
    if (wstat >> 8 == 0) {
      stack0xffffffffffffffe8->fnsave[0x1a] = 't';
      byte_copy(local_38,0x1a,stack0xffffffffffffffe8->fnsave);
      f[0x12] = 's';
      f[0x13] = '\0';
      while (iVar1 = rename(stack0xffffffffffffffe8->fnsave,local_38), iVar1 == -1) {
        pause2("unable to rename processed",stack0xffffffffffffffe8->name);
      }
      while (iVar1 = chmod(local_38,0x1e4), iVar1 == -1) {
        pause2("unable to set mode of processed",stack0xffffffffffffffe8->name);
      }
      stack0xffffffffffffffe8->fnsave[0x1a] = 'u';
      iVar1 = unlink(stack0xffffffffffffffe8->fnsave);
      if (iVar1 == -1) {
        strerr_warn("svlogd: warning: ","unable to unlink: ",stack0xffffffffffffffe8->name,"/",
                    stack0xffffffffffffffe8->fnsave,(char *)0x0,(strerr *)0x0);
      }
      while (iVar1 = rename("newstate","state"), iVar1 == -1) {
        pause2("unable to rename state",stack0xffffffffffffffe8->name);
      }
      if (verbose != 0) {
        strerr_warn("svlogd: info: ","processed: ",stack0xffffffffffffffe8->name,"/",local_38,
                    (char *)0x0,(strerr *)0x0);
      }
      while (iVar1 = fchdir(fdwdir), iVar1 == -1) {
        pause1("unable to change to initial working directory");
      }
      ld_local._4_4_ = 1;
    }
    else {
      warnx("processor failed, restart",stack0xffffffffffffffe8->name);
      stack0xffffffffffffffe8->fnsave[0x1a] = 't';
      unlink(stack0xffffffffffffffe8->fnsave);
      stack0xffffffffffffffe8->fnsave[0x1a] = 'u';
      processorstart(stack0xffffffffffffffe8);
      while (iVar1 = fchdir(fdwdir), iVar1 == -1) {
        pause1("unable to change to initial working directory");
      }
      ld_local._4_4_ = (uint)((stack0xffffffffffffffe8->processor).len == 0);
    }
  }
  return ld_local._4_4_;
}

Assistant:

unsigned int processorstop(struct logdir *ld) {
  char f[28];

  if (ld->ppid) {
    sig_unblock(sig_hangup);
    while (wait_pid(&wstat, ld->ppid) == -1)
      pause2("error waiting for processor", ld->name);
    sig_block(sig_hangup);
    ld->ppid =0;
  }
  if (ld->fddir == -1) return(1);
  while (fchdir(ld->fddir) == -1)
    pause2("unable to change directory, want processor", ld->name);
  if (wait_exitcode(wstat) != 0) {
    warnx("processor failed, restart", ld->name);
    ld->fnsave[26] ='t';
    unlink(ld->fnsave);
    ld->fnsave[26] ='u';
    processorstart(ld);
    while (fchdir(fdwdir) == -1)
      pause1("unable to change to initial working directory");
    return(ld->processor.len ? 0 : 1);
  }
  ld->fnsave[26] ='t';
  byte_copy(f, 26, ld->fnsave);
  f[26] ='s'; f[27] =0;
  while (rename(ld->fnsave, f) == -1)
    pause2("unable to rename processed", ld->name);
  while (chmod(f, 0744) == -1)
    pause2("unable to set mode of processed", ld->name);
  ld->fnsave[26] ='u';
  if (unlink(ld->fnsave) == -1)
    strerr_warn5(WARNING, "unable to unlink: ", ld->name, "/", ld->fnsave, 0);
  while (rename("newstate", "state") == -1)
    pause2("unable to rename state", ld->name);
  if (verbose) strerr_warn5(INFO, "processed: ", ld->name, "/", f, 0);
  while (fchdir(fdwdir) == -1)
    pause1("unable to change to initial working directory");
  return(1);
}